

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O1

void * chaiscript::detail::verify_type_no_throw<void>(Boxed_Value *ob,type_info *ti,void *ptr)

{
  element_type *this;
  bool bVar1;
  void *in_RAX;
  undefined8 *puVar2;
  
  this = (ob->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
  if (((this->m_type_info).m_flags & 1) == 0) {
    bVar1 = Type_Info::operator==(&this->m_type_info,ti);
    if (bVar1) {
      return in_RAX;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__bad_cast_005a4d58;
  __cxa_throw(puVar2,&exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

static T *verify_type_no_throw(const Boxed_Value &ob, const std::type_info &ti, T *ptr) {
      if (!ob.is_const() && ob.get_type_info() == ti) {
        return ptr;
      } else {
        throw chaiscript::detail::exception::bad_any_cast();
      }
    }